

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::outelements(tetgenmesh *this,tetgenio *out)

{
  memorypool *pmVar1;
  void **ppvVar2;
  tetrahedron ppdVar3;
  tetrahedron ppdVar4;
  tetrahedron ppdVar5;
  int *piVar6;
  size_t sVar7;
  tetrahedron *pppdVar8;
  tetgenbehavior *ptVar9;
  undefined4 *puVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  undefined8 uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  int local_474;
  int local_470;
  uint local_46c;
  ulong local_468;
  double *local_460;
  FILE *local_458;
  char outelefilename [1024];
  
  ptVar9 = this->b;
  if (out == (tetgenio *)0x0) {
    strcpy(outelefilename,ptVar9->outfilename);
    sVar7 = strlen(outelefilename);
    builtin_strncpy(outelefilename + sVar7,".ele",5);
    if (ptVar9->quiet == 0) {
      printf("Writing %s.\n",outelefilename);
    }
    lVar13 = this->tetrahedrons->items;
    lVar19 = this->hullsize;
    local_468 = (ulong)(uint)this->numelemattrib;
    local_458 = fopen(outelefilename,"w");
    if (local_458 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",outelefilename);
      puVar10 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar10 = 1;
      __cxa_throw(puVar10,&int::typeinfo,0);
    }
    uVar14 = 10;
    if (this->b->order == 1) {
      uVar14 = 4;
    }
    local_460 = (double *)0x0;
    fprintf(local_458,"%ld  %d  %d\n",lVar13 - lVar19,uVar14,local_468);
    ptVar9 = this->b;
    piVar6 = (int *)0x0;
  }
  else {
    if (ptVar9->quiet == 0) {
      puts("Writing elements.");
      ptVar9 = this->b;
    }
    lVar19 = this->tetrahedrons->items - this->hullsize;
    iVar17 = this->numelemattrib;
    local_468 = (ulong)iVar17;
    lVar13 = 10;
    if (ptVar9->order == 1) {
      lVar13 = 4;
    }
    piVar6 = (int *)operator_new__(-(ulong)((ulong)(lVar13 * lVar19) >> 0x3e != 0) |
                                   lVar13 * lVar19 * 4);
    out->tetrahedronlist = piVar6;
    if ((long)local_468 < 1) {
      local_460 = out->tetrahedronattributelist;
    }
    else {
      local_460 = (double *)
                  operator_new__(-(ulong)(local_468 * lVar19 >> 0x3d != 0) | local_468 * lVar19 * 8)
      ;
      out->tetrahedronattributelist = local_460;
    }
    out->numberoftetrahedra = (int)lVar19;
    iVar11 = 10;
    if (ptVar9->order == 1) {
      iVar11 = 4;
    }
    out->numberofcorners = iVar11;
    out->numberoftetrahedronattributes = iVar17;
    local_458 = (FILE *)0x0;
  }
  pmVar1 = this->tetrahedrons;
  uVar12 = this->in->firstnumber;
  uVar16 = 0;
  if (ptVar9->zeroindex == 0) {
    uVar16 = uVar12;
  }
  bVar20 = uVar12 == 1 && uVar16 == 0;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  pppdVar8 = tetrahedrontraverse(this);
  if (pppdVar8 != (tetrahedron *)0x0) {
    local_470 = 0;
    local_474 = 0;
    do {
      local_46c = (uint)bVar20;
      uVar18 = (uint)bVar20;
      ptVar9 = this->b;
      bVar21 = ptVar9->reversetetori == 0;
      lVar13 = (long)this->pointmarkindex;
      uVar12 = *(int *)((long)pppdVar8[(ulong)!bVar21 + 4] + lVar13 * 4) - uVar18;
      ppdVar3 = pppdVar8[(ulong)bVar21 + 4];
      ppdVar4 = pppdVar8[6];
      ppdVar5 = pppdVar8[7];
      if (out == (tetgenio *)0x0) {
        fprintf(local_458,"%5d   %5d %5d %5d %5d",(ulong)uVar16,(ulong)uVar12,
                (ulong)(*(int *)((long)ppdVar3 + lVar13 * 4) - uVar18),
                (ulong)(*(int *)((long)ppdVar4 + lVar13 * 4) - uVar18),
                (ulong)(*(int *)((long)ppdVar5 + lVar13 * 4) - uVar18));
        if (this->b->order == 2) {
          ppdVar3 = pppdVar8[0xb];
          lVar13 = (long)this->pointmarkindex;
          fprintf(local_458,"  %5d %5d %5d %5d %5d %5d",
                  (ulong)(*(int *)((long)*ppdVar3 + lVar13 * 4) - local_46c),
                  (ulong)(*(int *)((long)ppdVar3[1] + lVar13 * 4) - local_46c),
                  (ulong)(*(int *)((long)ppdVar3[2] + lVar13 * 4) - local_46c),
                  (ulong)(*(int *)((long)ppdVar3[3] + lVar13 * 4) - local_46c),
                  (ulong)(*(int *)((long)ppdVar3[4] + lVar13 * 4) - local_46c),
                  (ulong)(*(int *)((long)ppdVar3[5] + lVar13 * 4) - local_46c));
        }
        if (0 < (int)local_468) {
          lVar13 = 0;
          do {
            fprintf(local_458,"    %.17g",pppdVar8[this->elemattribindex + lVar13]);
            lVar13 = lVar13 + 1;
          } while ((int)local_468 != (int)lVar13);
        }
        fputc(10,local_458);
        ptVar9 = this->b;
      }
      else {
        lVar19 = (long)local_474;
        piVar6[lVar19] = uVar12;
        piVar6[lVar19 + 1] = *(int *)((long)ppdVar3 + lVar13 * 4) - uVar18;
        piVar6[lVar19 + 2] = *(int *)((long)ppdVar4 + lVar13 * 4) - uVar18;
        iVar17 = local_474 + 4;
        piVar6[lVar19 + 3] = *(int *)((long)ppdVar5 + lVar13 * 4) - uVar18;
        if (ptVar9->order == 2) {
          ppdVar3 = pppdVar8[0xb];
          piVar6[iVar17] = *(int *)((long)*ppdVar3 + lVar13 * 4) - uVar18;
          piVar6[lVar19 + 5] = *(int *)((long)ppdVar3[1] + lVar13 * 4) - uVar18;
          piVar6[lVar19 + 6] = *(int *)((long)ppdVar3[2] + lVar13 * 4) - uVar18;
          piVar6[lVar19 + 7] = *(int *)((long)ppdVar3[3] + lVar13 * 4) - uVar18;
          piVar6[lVar19 + 8] = *(int *)((long)ppdVar3[4] + lVar13 * 4) - uVar18;
          iVar17 = local_474 + 10;
          piVar6[lVar19 + 9] = *(int *)((long)ppdVar3[5] + lVar13 * 4) - uVar18;
        }
        local_474 = iVar17;
        if (0 < (int)local_468) {
          iVar17 = this->elemattribindex;
          uVar15 = 0;
          do {
            local_460[(long)local_470 + uVar15] = (double)pppdVar8[(long)iVar17 + uVar15];
            uVar15 = uVar15 + 1;
          } while ((local_468 & 0xffffffff) != uVar15);
          local_470 = local_470 + (int)uVar15;
        }
      }
      *(uint *)(pppdVar8 + 10) = uVar16;
      if (ptVar9->metric != 0) {
        iVar17 = this->point2simindex;
        lVar13 = 4;
        do {
          pppdVar8[lVar13][iVar17] = (double *)pppdVar8;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 8);
      }
      pppdVar8 = tetrahedrontraverse(this);
      uVar16 = uVar16 + 1;
    } while (pppdVar8 != (tetrahedron *)0x0);
  }
  if (out == (tetgenio *)0x0) {
    fprintf(local_458,"# Generated by %s\n",this->b->commandline);
    fclose(local_458);
  }
  return;
}

Assistant:

void tetgenmesh::outelements(tetgenio* out)
{
  FILE *outfile = NULL;
  char outelefilename[FILENAMESIZE];
  tetrahedron* tptr;
  point p1, p2, p3, p4;
  point *extralist;
  REAL *talist = NULL;
  int *tlist = NULL;
  long ntets;
  int firstindex, shift;
  int pointindex, attribindex;
  int highorderindex = 11; 
  int elementnumber;
  int eextras;
  int i;

  if (out == (tetgenio *) NULL) {
    strcpy(outelefilename, b->outfilename);
    strcat(outelefilename, ".ele");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outelefilename);
    } else {
      printf("Writing elements.\n");
    }
  }

  // The number of tets excluding hull tets.
  ntets = tetrahedrons->items - hullsize;

  eextras = numelemattrib;
  if (out == (tetgenio *) NULL) {
    outfile = fopen(outelefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outelefilename);
      terminatetetgen(this, 1);
    }
    // Number of tetras, points per tetra, attributes per tetra.
    fprintf(outfile, "%ld  %d  %d\n", ntets, b->order == 1 ? 4 : 10, eextras);
  } else {
    // Allocate memory for output tetrahedra.
    out->tetrahedronlist = new int[ntets * (b->order == 1 ? 4 : 10)];
    if (out->tetrahedronlist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    // Allocate memory for output tetrahedron attributes if necessary.
    if (eextras > 0) {
      out->tetrahedronattributelist = new REAL[ntets * eextras];
      if (out->tetrahedronattributelist == (REAL *) NULL) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this, 1);
      }
    }
    out->numberoftetrahedra = ntets;
    out->numberofcorners = b->order == 1 ? 4 : 10;
    out->numberoftetrahedronattributes = eextras;
    tlist = out->tetrahedronlist;
    talist = out->tetrahedronattributelist;
    pointindex = 0;
    attribindex = 0;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shift.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  tetrahedrons->traversalinit();
  tptr = tetrahedrontraverse();
  elementnumber = firstindex; // in->firstnumber;
  while (tptr != (tetrahedron *) NULL) {
    if (!b->reversetetori) {
      p1 = (point) tptr[4];
      p2 = (point) tptr[5];
    } else {
      p1 = (point) tptr[5];
      p2 = (point) tptr[4];
    }
    p3 = (point) tptr[6];
    p4 = (point) tptr[7];
    if (out == (tetgenio *) NULL) {
      // Tetrahedron number, indices for four points.
      fprintf(outfile, "%5d   %5d %5d %5d %5d", elementnumber,
              pointmark(p1) - shift, pointmark(p2) - shift,
              pointmark(p3) - shift, pointmark(p4) - shift);
      if (b->order == 2) {
        extralist = (point *) tptr[highorderindex];
        // indices for six extra points.
        fprintf(outfile, "  %5d %5d %5d %5d %5d %5d",
          pointmark(extralist[0]) - shift, pointmark(extralist[1]) - shift,
          pointmark(extralist[2]) - shift, pointmark(extralist[3]) - shift,
          pointmark(extralist[4]) - shift, pointmark(extralist[5]) - shift);
      }
      for (i = 0; i < eextras; i++) {
        fprintf(outfile, "    %.17g", elemattribute(tptr, i));
      }
      fprintf(outfile, "\n");
    } else {
      tlist[pointindex++] = pointmark(p1) - shift;
      tlist[pointindex++] = pointmark(p2) - shift;
      tlist[pointindex++] = pointmark(p3) - shift;
      tlist[pointindex++] = pointmark(p4) - shift;
      if (b->order == 2) {
        extralist = (point *) tptr[highorderindex];
        tlist[pointindex++] = pointmark(extralist[0]) - shift;
        tlist[pointindex++] = pointmark(extralist[1]) - shift;
        tlist[pointindex++] = pointmark(extralist[2]) - shift;
        tlist[pointindex++] = pointmark(extralist[3]) - shift;
        tlist[pointindex++] = pointmark(extralist[4]) - shift;
        tlist[pointindex++] = pointmark(extralist[5]) - shift;
      }
      for (i = 0; i < eextras; i++) {
        talist[attribindex++] = elemattribute(tptr, i);
      }
    }
    // Remember the index of this element (for counting edges).
    setelemindex(tptr, elementnumber);
	if (b->metric) { // -m option
	  // Update the point-to-tet map, so that every point is pointing
	  //   to a real tet, not a fictious one. Used by .p2t file.
	  for (int i = 0; i < 4; i++) {
	    setpoint2tet((point) (tptr[4 + i]), (tetrahedron) tptr);
	  }
	}
    tptr = tetrahedrontraverse();
    elementnumber++;
  }


  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}